

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hpp
# Opt level: O0

index_t * __thiscall type_safe::index_t::operator+=(index_t *this,difference_t *rhs)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong *puVar4;
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *piVar5;
  index_t *local_188;
  index_t *local_178;
  ulong local_160;
  ulong local_148;
  index_t *local_140;
  index_t *local_138;
  difference_t *local_130;
  difference_t *rhs_local;
  index_t *this_local;
  index_t *local_118;
  index_t **local_110;
  undefined1 local_108 [8];
  index_t *local_100;
  integer<long,_type_safe::undefined_behavior_arithmetic> *local_f8;
  ulong *local_f0;
  undefined1 local_e8 [8];
  ulong local_e0;
  ulong local_d8;
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_d0;
  undefined1 local_c8 [8];
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_c0;
  char *local_b8;
  undefined4 local_b0;
  regular_void local_a1;
  index_t **local_a0;
  integer<long,_type_safe::undefined_behavior_arithmetic> *local_98;
  ulong *local_90;
  index_t **local_88;
  index_t **local_80;
  undefined1 *local_78;
  char *local_70;
  undefined4 local_68;
  regular_void local_59;
  long local_58;
  ulong local_50;
  ulong *local_48;
  undefined1 *local_40;
  index_t **local_38;
  undefined1 *local_30;
  char *local_28;
  undefined4 local_20;
  regular_void local_11;
  ulong *local_10;
  
  local_130 = rhs;
  rhs_local = (difference_t *)this;
  local_d0 = get<type_safe::index_t,type_safe::integer<unsigned_long,type_safe::undefined_behavior_arithmetic>>
                       (&this->
                         super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
                       );
  uVar1 = local_d0->value_;
  local_10 = &local_e0;
  local_e0 = uVar1;
  local_c0 = local_d0;
  uVar3 = std::numeric_limits<long>::max();
  if (uVar3 < uVar1) {
    local_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_20 = 0x167;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[26]>
              (debug_assert::detail::always_false,&local_28,"","conversion would overflow");
    puVar4 = (ulong *)debug_assert::detail::regular_void::operator_cast_to_long_(&local_11);
    local_160 = *puVar4;
  }
  else {
    local_160 = *local_10;
  }
  local_d8 = local_160;
  local_40 = local_c8;
  local_48 = &local_d8;
  local_148 = local_160;
  local_f8 = get<type_safe::difference_t,type_safe::integer<long,type_safe::undefined_behavior_arithmetic>>
                       (&local_130->
                         super_strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
                       );
  local_f0 = &local_148;
  local_50 = local_148;
  local_58 = local_f8->value_;
  local_98 = local_f8;
  local_90 = local_f0;
  bVar2 = detail::will_addition_error<long>(local_148,local_58);
  if (bVar2) {
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
    ;
    local_68 = 0x91;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[33]>
              (debug_assert::detail::always_false,&local_70,"","addition will result in overflow");
    puVar4 = (ulong *)debug_assert::detail::regular_void::operator_cast_to_long_(&local_59);
    local_178 = (index_t *)*puVar4;
  }
  else {
    local_178 = (index_t *)(local_50 + local_58);
  }
  local_100 = local_178;
  local_30 = local_e8;
  local_38 = &local_100;
  local_140 = local_178;
  local_110 = &local_140;
  this_local = local_178;
  local_a0 = &this_local;
  local_88 = local_110;
  if ((long)local_178 < 0) {
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_b0 = 0x186;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[27]>
              (debug_assert::detail::always_false,&local_b8,"","conversion would underflow");
    puVar4 = debug_assert::detail::regular_void::operator_cast_to_unsigned_long_(&local_a1);
    local_188 = (index_t *)*puVar4;
  }
  else {
    local_188 = local_178;
  }
  local_118 = local_188;
  local_78 = local_108;
  local_80 = &local_118;
  local_138 = local_188;
  piVar5 = get<type_safe::index_t,type_safe::integer<unsigned_long,type_safe::undefined_behavior_arithmetic>>
                     (&this->
                       super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
                     );
  piVar5->value_ = (integer_type_conflict1)local_138;
  return this;
}

Assistant:

index_t& operator+=(const difference_t& rhs) noexcept
    {
        get(*this) = make_unsigned(make_signed(get(*this)) + get(rhs));
        return *this;
    }